

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  curl_socket_t s;
  connectdata *conn;
  uint uVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  Curl_sh_entry *pCVar7;
  void *pvVar8;
  ulong uVar9;
  Curl_easy *pCVar10;
  curl_llist_element *pcVar11;
  int in_EDX;
  uint uVar12;
  int s_00;
  curl_hash *sh;
  curl_socket_t local_5c;
  Curl_multi *local_58;
  curl_socket_t *local_50;
  curl_socket_t socks [5];
  
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    socks[lVar6] = -1;
  }
  uVar4 = multi_getsock(data,socks,in_EDX);
  sh = &multi->sockhash;
  local_58 = multi;
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    if ((uVar4 >> ((byte)lVar6 & 0x1f) & 0x10001) == 0) {
      uVar4 = (uint)lVar6;
      goto LAB_00414f11;
    }
    s = socks[lVar6];
    pCVar7 = sh_getentry(sh,s);
    uVar12 = uVar4 >> ((byte)lVar6 & 0x1f);
    uVar5 = uVar12 & 1;
    uVar2 = uVar5 + 2;
    if ((uVar12 >> 0x10 & 1) == 0) {
      uVar2 = uVar5;
    }
    if (pCVar7 == (Curl_sh_entry *)0x0) {
      local_5c = s;
      pCVar7 = sh_getentry(sh,s);
      if (pCVar7 == (Curl_sh_entry *)0x0) {
        pCVar7 = (Curl_sh_entry *)(*Curl_ccalloc)(1,0x18);
        if (pCVar7 == (Curl_sh_entry *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        pCVar7->easy = data;
        pCVar7->socket = s;
        pvVar8 = Curl_hash_add(sh,&local_5c,4,pCVar7);
        if (pvVar8 == (void *)0x0) {
          (*Curl_cfree)(pCVar7);
          return CURLM_OUT_OF_MEMORY;
        }
      }
LAB_00414ed5:
      if (local_58->socket_cb != (curl_socket_callback)0x0) {
        (*local_58->socket_cb)(data,s,uVar2,local_58->socket_userp,pCVar7->socketp);
      }
      pCVar7->action = uVar2;
    }
    else if (pCVar7->action != uVar2) goto LAB_00414ed5;
  }
  uVar4 = 5;
LAB_00414f11:
  local_50 = data->sockets;
  lVar6 = 0;
  do {
    if (data->numsocks <= lVar6) {
      memcpy(local_50,socks,(ulong)uVar4 << 2);
      data->numsocks = uVar4;
      return CURLM_OK;
    }
    s_00 = local_50[lVar6];
    uVar9 = 0;
    do {
      if (uVar4 == uVar9) goto LAB_00414f59;
      piVar1 = socks + uVar9;
      uVar9 = uVar9 + 1;
    } while (s_00 != *piVar1);
    s_00 = -1;
LAB_00414f59:
    pCVar7 = sh_getentry(sh,s_00);
    if (pCVar7 != (Curl_sh_entry *)0x0) {
      conn = data->easy_conn;
      if (conn == (connectdata *)0x0) {
LAB_00414f93:
        if (local_58->socket_cb != (curl_socket_callback)0x0) {
          (*local_58->socket_cb)(data,s_00,4,local_58->socket_userp,pCVar7->socketp);
        }
        sh_delentry(sh,s_00);
      }
      else {
        if ((conn->recv_pipe).size < 2) {
          if ((conn->send_pipe).size < 2) goto LAB_00414f93;
          pCVar10 = pCVar7->easy;
        }
        else {
          pCVar10 = pCVar7->easy;
          if (pCVar10 == data) {
            _Var3 = Curl_recvpipe_head(data,conn);
            pcVar11 = (conn->recv_pipe).head;
            if (_Var3) {
              pcVar11 = pcVar11->next;
            }
            pCVar10 = (Curl_easy *)pcVar11->ptr;
            pCVar7->easy = pCVar10;
          }
          if ((conn->send_pipe).size < 2) goto LAB_00415021;
        }
        if (pCVar10 == data) {
          _Var3 = Curl_sendpipe_head(data,conn);
          pcVar11 = (conn->send_pipe).head;
          if (_Var3) {
            pCVar10 = (Curl_easy *)pcVar11->next->ptr;
          }
          else {
            pCVar10 = (Curl_easy *)pcVar11->ptr;
          }
          pCVar7->easy = pCVar10;
        }
      }
    }
LAB_00415021:
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    int action = CURL_POLL_NONE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    if(entry) {
      /* yeps, already present so check if it has the same action set */
      if(entry->action == action)
        /* same, continue */
        continue;
    }
    else {
      /* this is a socket we didn't have before, add it! */
      entry = sh_addentry(&multi->sockhash, s, data);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       action,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = action; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    s = data->sockets[i];
    for(j = 0; j<num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        s = CURL_SOCKET_BAD;
        break;
      }
    }

    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* this socket has been removed. Tell the app to remove it */
      bool remove_sock_from_hash = TRUE;

      /* check if the socket to be removed serves a connection which has
         other easy-s in a pipeline. In this case the socket should not be
         removed. */
      struct connectdata *easy_conn = data->easy_conn;
      if(easy_conn) {
        if(easy_conn->recv_pipe.size > 1) {
          /* the handle should not be removed from the pipe yet */
          remove_sock_from_hash = FALSE;

          /* Update the sockhash entry to instead point to the next in line
             for the recv_pipe, or the first (in case this particular easy
             isn't already) */
          if(entry->easy == data) {
            if(Curl_recvpipe_head(data, easy_conn))
              entry->easy = easy_conn->recv_pipe.head->next->ptr;
            else
              entry->easy = easy_conn->recv_pipe.head->ptr;
          }
        }
        if(easy_conn->send_pipe.size > 1) {
          /* the handle should not be removed from the pipe yet */
          remove_sock_from_hash = FALSE;

          /* Update the sockhash entry to instead point to the next in line
             for the send_pipe, or the first (in case this particular easy
             isn't already) */
          if(entry->easy == data) {
            if(Curl_sendpipe_head(data, easy_conn))
              entry->easy = easy_conn->send_pipe.head->next->ptr;
            else
              entry->easy = easy_conn->send_pipe.head->ptr;
          }
        }
        /* Don't worry about overwriting recv_pipe head with send_pipe_head,
           when action will be asked on the socket (see multi_socket()), the
           head of the correct pipe will be taken according to the
           action. */
      }

      if(remove_sock_from_hash) {
        /* in this case 'entry' is always non-NULL */
        if(multi->socket_cb)
          multi->socket_cb(data,
                           s,
                           CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }
    } /* if sockhash entry existed */
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  data->numsocks = num;
  return CURLM_OK;
}